

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoothsort.h
# Opt level: O2

void __thiscall TLeonardoHeap<double>::dequeue_max(TLeonardoHeap<double> *this,size_t element)

{
  ulong uVar1;
  ushort uVar2;
  
  uVar2 = this->first_tree;
  if (1 < uVar2) {
    this->tree_vector = this->tree_vector * 2 ^ 3;
    uVar2 = uVar2 - 2;
    this->first_tree = uVar2;
    filter(this,~Leonardo_k[uVar2] + element,(ulong)uVar2 + 1,false);
    this->tree_vector = this->tree_vector * 2 + 1;
    filter(this,element - 1,(ulong)this->first_tree,false);
    return;
  }
  uVar1 = this->tree_vector >> 1;
  this->tree_vector = uVar1;
  if (uVar2 == 0) {
    this->first_tree = 1;
  }
  else {
    this->first_tree = uVar2 + 1;
    uVar2 = 2;
    while (((ulong)uVar2 < this->N + 1 && ((uVar1 & 1) == 0))) {
      uVar2 = uVar2 + 1;
      this->first_tree = uVar2;
      uVar1 = uVar1 >> 1;
      this->tree_vector = uVar1;
    }
  }
  return;
}

Assistant:

inline void TLeonardoHeap<T>::dequeue_max(size_t element) {
	if(first_tree >= 2) {	// Root is of order greater than two
		// Expose the two child nodes as tree roots
		// Restore the ascending root and max-heap properties of the exposed tree to the left
		tree_vector = (tree_vector << 1) ^ 3;	// w1 -> w01
		first_tree -= 2;
		filter(element-Leonardo_k[first_tree]-1, first_tree+1, false);
		// Restore the ascending root and max-heap properties of the exposed tree to the right
		tree_vector = (tree_vector << 1) | 1;	// w01 -> w011
		filter(element-1, first_tree, false);
	} else if(first_tree == 0) {
		// Remove the Lt_0 tree, leaving the Lt_1 tree on the right
		tree_vector >>= 1;
		first_tree = 1;
	} else {	// The rightmost root is of order 1
		// Search for the next tree
		tree_vector >>=1;
		first_tree++;
		for(; first_tree<N+1; first_tree++, tree_vector>>=1) { if(tree_vector & 1) { break; } }
	}
}